

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dropt_handlers.c
# Opt level: O1

dropt_error
dropt_handle_string(dropt_context *context,dropt_option *option,dropt_char *optionArgument,
                   void *dest)

{
  bool bVar1;
  dropt_error dVar2;
  
  if (dest == (void *)0x0) {
    dropt_misuse("No handler destination specified.",
                 "/workspace/llm4binary/github/license_c_cmakelists/jamesderlin[P]dropt/src/dropt_handlers.c"
                 ,0x1c9);
    dVar2 = 2;
    bVar1 = false;
  }
  else {
    bVar1 = optionArgument != (dropt_char *)0x0;
    dVar2 = (uint)(optionArgument == (dropt_char *)0x0) * 5;
  }
  if (bVar1) {
    *(dropt_char **)dest = optionArgument;
  }
  return dVar2;
}

Assistant:

dropt_error
dropt_handle_string(dropt_context* context,
                    const dropt_option* option,
                    const dropt_char* optionArgument,
                    void* dest)
{
    dropt_error err = dropt_error_none;
    const dropt_char** out = dest;

    if (out == NULL)
    {
        DROPT_MISUSE("No handler destination specified.");
        err = dropt_error_bad_configuration;
    }
    else if (optionArgument == NULL)
    {
        err = dropt_error_insufficient_arguments;
    }

    if (err == dropt_error_none) { *out = optionArgument; }
    return err;
}